

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void collectCustomModelNamesAndDescriptions
               (Model *model,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *output)

{
  uint32 uVar1;
  int iVar2;
  Rep *pRVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  Pipeline *pPVar4;
  PipelineRegressor *pPVar5;
  CustomModel *pCVar6;
  PipelineClassifier *pPVar7;
  long lVar8;
  void **ppvVar9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  uVar1 = model->_oneof_case_[0];
  if (uVar1 == 200) {
    pPVar7 = CoreML::Specification::Model::pipelineclassifier(model);
    pPVar4 = pPVar7->pipeline_;
    if (pPVar4 == (Pipeline *)0x0) {
      pPVar4 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
    }
    pRVar3 = (pPVar4->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    iVar2 = (pPVar4->models_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar8 = 0; (long)iVar2 * 8 != lVar8; lVar8 = lVar8 + 8) {
      collectCustomModelNamesAndDescriptions(*(Model **)((long)ppvVar9 + lVar8),output);
    }
  }
  else if (uVar1 == 0xc9) {
    pPVar5 = CoreML::Specification::Model::pipelineregressor(model);
    pPVar4 = pPVar5->pipeline_;
    if (pPVar4 == (Pipeline *)0x0) {
      pPVar4 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
    }
    pRVar3 = (pPVar4->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    iVar2 = (pPVar4->models_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar8 = 0; (long)iVar2 * 8 != lVar8; lVar8 = lVar8 + 8) {
      collectCustomModelNamesAndDescriptions(*(Model **)((long)ppvVar9 + lVar8),output);
    }
  }
  else if (uVar1 == 0x22b) {
    pCVar6 = CoreML::Specification::Model::custommodel(model);
    __a = (pCVar6->classname_).ptr_;
    pCVar6 = CoreML::Specification::Model::custommodel(model);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_60,__a,(pCVar6->description_).ptr_);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)output,&local_60);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_60);
  }
  else if (uVar1 == 0xca) {
    pPVar4 = CoreML::Specification::Model::pipeline(model);
    pRVar3 = (pPVar4->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    iVar2 = (pPVar4->models_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar8 = 0; (long)iVar2 * 8 != lVar8; lVar8 = lVar8 + 8) {
      collectCustomModelNamesAndDescriptions(*(Model **)((long)ppvVar9 + lVar8),output);
    }
  }
  return;
}

Assistant:

inline void collectCustomModelNamesAndDescriptions(const Specification::Model &model, std::vector<StringPair> *output) {

    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                collectCustomModelNamesAndDescriptions(m,output);
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                collectCustomModelNamesAndDescriptions(m,output);
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                collectCustomModelNamesAndDescriptions(m,output);
            }
            break;
        case Specification::Model::kCustomModel:
            output->push_back(std::make_pair(model.custommodel().classname(),model.custommodel().description()));
            break;
        default:
            break;
    }
}